

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsPathToMacOSSharedLibrary(string *path)

{
  string_view str;
  bool bVar1;
  bool local_21;
  string *path_local;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  local_21 = false;
  if (bVar1) {
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)path);
    local_21 = cmHasLiteralSuffix<7ul>(str,(char (*) [7])".dylib");
  }
  return local_21;
}

Assistant:

bool cmSystemTools::IsPathToMacOSSharedLibrary(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".dylib"));
}